

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArraySubImage3D::checkResults
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong __n;
  reference pvVar6;
  reference __s2;
  uint local_60;
  GLuint layer_nr;
  allocator<unsigned_int> local_4d;
  value_type_conflict4 local_4c;
  undefined1 local_48 [8];
  DataBufferVec result_data_buffer;
  GLuint n_elements;
  Functions *gl;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArraySubImage3D *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  result_data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = width * height * depth * 4;
  __n = (ulong)result_data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_4c = 0;
  std::allocator<unsigned_int>::allocator(&local_4d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__n,&local_4c,&local_4d
            );
  std::allocator<unsigned_int>::~allocator(&local_4d);
  for (local_60 = 0; local_60 < depth; local_60 = local_60 + 1) {
    (**(code **)(lVar5 + 0x6b8))(0x8ca8,0x8ce0,this->m_tex_cube_map_array_id,0,local_60);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not attach texture object to framebuffer\'s attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x1bc);
    TestCaseBase::checkFramebufferStatus(&this->super_TestCaseBase,0x8ca8);
    pcVar1 = *(code **)(lVar5 + 0x1220);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                        (ulong)(local_60 * width * height * 4));
    (*pcVar1)(0,0,width,height,0x8d99,0x1405,pvVar6);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not read pixels from framebuffer\'s attachment!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x1c4);
  }
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
  __s2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   (&this->m_expected_data_buffer,0);
  iVar2 = memcmp(pvVar6,__s2,
                 (ulong)result_data_buffer.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ << 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return iVar2 == 0;
}

Assistant:

bool TextureCubeMapArraySubImage3D::checkResults(glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint   n_elements = width * height * depth * m_n_components;
	DataBufferVec result_data_buffer(n_elements, 0);

	for (glw::GLuint layer_nr = 0; layer_nr < depth; ++layer_nr)
	{
		/* attach one layer to framebuffer's attachment */
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_tex_cube_map_array_id, 0, layer_nr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to framebuffer's attachment");

		/* check framebuffer status */
		checkFramebufferStatus(GL_READ_FRAMEBUFFER);

		/* read data from the texture */
		gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					  &result_data_buffer[layer_nr * width * height * m_n_components]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels from framebuffer's attachment!");
	}

	return memcmp(&result_data_buffer[0], &m_expected_data_buffer[0], n_elements * sizeof(glw::GLuint)) == 0;
}